

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_mdef_convert.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *filename;
  char *filename_00;
  bool bVar1;
  int iVar2;
  bin_mdef_t *pbVar3;
  int tobin;
  bin_mdef_t *bin;
  char *outfile;
  char *infile;
  char **argv_local;
  int argc_local;
  
  bVar1 = true;
  if ((argc < 3) || (4 < argc)) {
    fprintf(_stderr,"Usage: %s [-text | -bin] INPUT OUTPUT\n",*argv);
    return 1;
  }
  infile = (char *)argv;
  if (*argv[1] == '-') {
    iVar2 = strcmp(argv[1],"-text");
    if (iVar2 == 0) {
      bVar1 = false;
    }
    else {
      iVar2 = strcmp(argv[1],"-bin");
      if (iVar2 != 0) {
        fprintf(_stderr,"Unknown argument %s\n",argv[1]);
        fprintf(_stderr,"Usage: %s [-text | -bin] INPUT OUTPUT\n",*argv);
        return 1;
      }
      bVar1 = true;
    }
    infile = (char *)(argv + 1);
  }
  filename = *(char **)(infile + 8);
  filename_00 = *(char **)(infile + 0x10);
  if (bVar1) {
    pbVar3 = bin_mdef_read_text((ps_config_t *)0x0,filename);
    if (pbVar3 == (bin_mdef_t *)0x0) {
      fprintf(_stderr,"Failed to read text mdef from %s\n",filename);
      return 1;
    }
    iVar2 = bin_mdef_write(pbVar3,filename_00);
    if (iVar2 < 0) {
      fprintf(_stderr,"Failed to write binary mdef to %s\n",filename_00);
      return 1;
    }
  }
  else {
    pbVar3 = bin_mdef_read((ps_config_t *)0x0,filename);
    if (pbVar3 == (bin_mdef_t *)0x0) {
      fprintf(_stderr,"Failed to read binary mdef from %s\n",filename);
      return 1;
    }
    iVar2 = bin_mdef_write_text(pbVar3,filename_00);
    if (iVar2 < 0) {
      fprintf(_stderr,"Failed to write text mdef to %s\n",filename_00);
      return 1;
    }
  }
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
    const char *infile, *outfile;
    bin_mdef_t *bin;
    int tobin = 1;

    if (argc < 3 || argc > 4) {
        fprintf(stderr, "Usage: %s [-text | -bin] INPUT OUTPUT\n",
                argv[0]);
        return 1;
    }
    if (argv[1][0] == '-') {
        if (strcmp(argv[1], "-text") == 0) {
            tobin = 0;
            ++argv;
        }
        else if (strcmp(argv[1], "-bin") == 0) {
            tobin = 1;
            ++argv;
        }
        else {
            fprintf(stderr, "Unknown argument %s\n", argv[1]);
            fprintf(stderr, "Usage: %s [-text | -bin] INPUT OUTPUT\n",
                    argv[0]);
            return 1;
        }
    }
    infile = argv[1];
    outfile = argv[2];

    if (tobin) {
        if ((bin = bin_mdef_read_text(NULL, infile)) == NULL) {
            fprintf(stderr, "Failed to read text mdef from %s\n", infile);
            return 1;
        }
        if (bin_mdef_write(bin, outfile) < 0) {
            fprintf(stderr, "Failed to write binary mdef to %s\n",
                    outfile);
            return 1;
        }
    }
    else {
        if ((bin = bin_mdef_read(NULL, infile)) == NULL) {
            fprintf(stderr, "Failed to read binary mdef from %s\n",
                    infile);
            return 1;
        }
        if (bin_mdef_write_text(bin, outfile) < 0) {
            fprintf(stderr, "Failed to write text mdef to %s\n", outfile);
            return 1;
        }
    }

    return 0;
}